

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileSimpleString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  char cVar1;
  uint uVar2;
  SyToken *pValue;
  jx9_vm *pjVar3;
  uint in_EAX;
  sxi32 sVar4;
  jx9_value *pObj;
  sxu32 sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  sxu32 nIdx;
  undefined8 uStack_38;
  
  pValue = pGen->pIn;
  uStack_38 = (ulong)in_EAX;
  pcVar8 = (pValue->sData).zString;
  uVar2 = (pValue->sData).nByte;
  sVar4 = GenStateFindLiteral(pGen,&pValue->sData,(sxu32 *)((long)&uStack_38 + 4));
  if (sVar4 == 0) {
    sVar4 = 0;
    jx9VmEmitInstr(pGen->pVm,4,0,uStack_38._4_4_,(void *)0x0,(sxu32 *)0x0);
  }
  else {
    pObj = jx9VmReserveConstObj(pGen->pVm,(sxu32 *)((long)&uStack_38 + 4));
    if (pObj == (jx9_value *)0x0) {
      jx9GenCompileError(pGen,1,1,"JX9 engine is running out of memory");
      sVar4 = -10;
    }
    else {
      pjVar3 = pGen->pVm;
      pObj->pVm = (jx9_vm *)0x0;
      (pObj->sBlob).pAllocator = (SyMemBackend *)0x0;
      *(undefined8 *)&(pObj->sBlob).nFlags = 0;
      *(undefined8 *)&pObj->nIdx = 0;
      (pObj->x).rVal = 0.0;
      *(undefined8 *)&pObj->iFlags = 0;
      (pObj->sBlob).pBlob = (void *)0x0;
      (pObj->sBlob).nByte = 0;
      (pObj->sBlob).mByte = 0;
      pObj->pVm = pjVar3;
      (pObj->sBlob).pAllocator = &pjVar3->sAllocator;
      (pObj->sBlob).nFlags = 0;
      pObj->iFlags = 1;
      if (uVar2 != 0) {
        pcVar6 = pcVar8 + uVar2;
        pcVar7 = pcVar8;
LAB_0012abb5:
        do {
          if (*pcVar8 != '\\') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 < pcVar6) goto LAB_0012abb5;
          }
          if (pcVar7 < pcVar8) {
            sVar5 = (int)pcVar8 - (int)pcVar7;
          }
          else {
            pcVar7 = "";
            sVar5 = 0;
          }
          jx9MemObjStringAppend(pObj,pcVar7,sVar5);
          if (pcVar8 + 1 < pcVar6) {
            cVar1 = pcVar8[1];
            if (cVar1 == '\'') {
              pcVar7 = "\'";
LAB_0012ac12:
              sVar5 = 1;
            }
            else {
              if (cVar1 == '\\') {
                pcVar7 = "\\";
                goto LAB_0012ac12;
              }
              sVar5 = 2;
              pcVar7 = pcVar8;
            }
            jx9MemObjStringAppend(pObj,pcVar7,sVar5);
          }
          pcVar8 = pcVar8 + 2;
          pcVar7 = pcVar8;
        } while (pcVar8 < pcVar6);
      }
      jx9VmEmitInstr(pGen->pVm,4,0,uStack_38._4_4_,(void *)0x0,(sxu32 *)0x0);
      sVar4 = 0;
      if (((pValue->sData).nByte < 0x400) && (sVar5 = (pObj->sBlob).nByte, sVar4 = 0, sVar5 != 0)) {
        SyHashInsert(&pGen->hLiteral,(pObj->sBlob).pBlob,sVar5,(void *)(uStack_38 >> 0x20));
      }
    }
  }
  return sVar4;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileSimpleString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyString *pStr = &pGen->pIn->sData; /* Constant string literal */
	const char *zIn, *zCur, *zEnd;
	jx9_value *pObj;
	sxu32 nIdx;
	nIdx = 0; /* Prevent compiler warning */
	/* Delimit the string */
	zIn  = pStr->zString;
	zEnd = &zIn[pStr->nByte];
	if( zIn > zEnd ){
		/* Empty string, load NULL */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
		return SXRET_OK;
	}
	if( SXRET_OK == GenStateFindLiteral(&(*pGen), pStr, &nIdx) ){
		/* Already processed, emit the load constant instruction
		 * and return.
		 */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
		return SXRET_OK;
	}
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, 1, "JX9 engine is running out of memory");
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	jx9MemObjInitFromString(pGen->pVm, pObj, 0);
	/* Compile the node */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append raw contents*/
			jx9MemObjStringAppend(pObj, zCur, (sxu32)(zIn-zCur));
		}
		else
		{
			jx9MemObjStringAppend(pObj, "", 0);
		}
		zIn++;
		if( zIn < zEnd ){
			if( zIn[0] == '\\' ){
				/* A literal backslash */
				jx9MemObjStringAppend(pObj, "\\", sizeof(char));
			}else if( zIn[0] == '\'' ){
				/* A single quote */
				jx9MemObjStringAppend(pObj, "'", sizeof(char));
			}else{
				/* verbatim copy */
				zIn--;
				jx9MemObjStringAppend(pObj, zIn, sizeof(char)*2);
				zIn++;
			}
		}
		/* Advance the stream cursor */
		zIn++;
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	if( pStr->nByte < 1024 ){
		/* Install in the literal table */
		GenStateInstallLiteral(pGen, pObj, nIdx);
	}
	/* Node successfully compiled */
	return SXRET_OK;
}